

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_iterator_suite.cpp
# Opt level: O0

void insert_map(void)

{
  insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *piVar1;
  basic_variable<std::allocator<char>_> *local_f18;
  type *local_f00;
  basic_variable<std::allocator<char>_> *local_ee8;
  basic_variable<std::allocator<char>_> *local_ed0;
  basic_variable<std::allocator<char>_> *local_eb8;
  basic_variable<std::allocator<char>_> *local_ea0;
  basic_variable<std::allocator<char>_> *local_e88;
  basic_variable<std::allocator<char>_> *local_e70;
  basic_variable<std::allocator<char>_> *local_e58;
  basic_variable<std::allocator<char>_> *local_e08;
  basic_variable<std::allocator<char>_> *local_de0;
  basic_variable<std::allocator<char>_> *local_db8;
  basic_variable<std::allocator<char>_> *local_d90;
  basic_variable<std::allocator<char>_> *local_d68;
  basic_variable<std::allocator<char>_> *local_d40;
  basic_variable<std::allocator<char>_> *local_d18;
  basic_variable<std::allocator<char>_> *local_cf0;
  iterator local_cc8;
  iterator local_cb0;
  iterator local_c98;
  iterator local_c80;
  undefined1 local_c61;
  basic_variable<std::allocator<char>_> *local_c60;
  basic_variable<std::allocator<char>_> local_c58;
  basic_variable<std::allocator<char>_> local_c28;
  undefined1 auStack_bf8 [32];
  basic_variable<std::allocator<char>_> local_bd8;
  basic_variable<std::allocator<char>_> local_ba8;
  undefined1 auStack_b78 [32];
  basic_variable<std::allocator<char>_> local_b58;
  basic_variable<std::allocator<char>_> local_b28;
  undefined1 auStack_af8 [32];
  basic_variable<std::allocator<char>_> local_ad8;
  basic_variable<std::allocator<char>_> local_aa8;
  undefined1 auStack_a78 [32];
  basic_variable<std::allocator<char>_> local_a58;
  basic_variable<std::allocator<char>_> local_a28;
  undefined1 auStack_9f8 [32];
  basic_variable<std::allocator<char>_> local_9d8;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 auStack_978 [32];
  type local_958;
  basic_variable<std::allocator<char>_> local_928;
  type local_8f8;
  basic_variable<std::allocator<char>_> local_8d8;
  basic_variable<std::allocator<char>_> local_8a8;
  undefined1 auStack_878 [32];
  basic_variable<std::allocator<char>_> local_858;
  basic_variable<std::allocator<char>_> local_828;
  basic_variable<std::allocator<char>_> local_7f8;
  basic_variable<std::allocator<char>_> local_7c8;
  basic_variable<std::allocator<char>_> local_798;
  basic_variable<std::allocator<char>_> local_768;
  basic_variable<std::allocator<char>_> local_738;
  basic_variable<std::allocator<char>_> local_708;
  undefined1 local_6d8 [24];
  variable expect;
  size_type local_690 [2];
  basic_variable<std::allocator<char>_> *local_680;
  basic_variable<std::allocator<char>_> local_678;
  basic_variable<std::allocator<char>_> local_648;
  undefined1 local_618 [68];
  undefined4 local_5d4;
  size_type local_5d0 [2];
  basic_variable<std::allocator<char>_> *local_5c0;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_558 [68];
  undefined4 local_514;
  size_type local_510 [2];
  basic_variable<std::allocator<char>_> *local_500;
  basic_variable<std::allocator<char>_> local_4f8;
  basic_variable<std::allocator<char>_> local_4c8;
  undefined1 local_498 [68];
  undefined4 local_454;
  size_type local_450 [2];
  basic_variable<std::allocator<char>_> *local_440;
  basic_variable<std::allocator<char>_> local_438;
  basic_variable<std::allocator<char>_> local_408;
  undefined1 local_3d8 [68];
  undefined4 local_394;
  size_type local_390 [2];
  basic_variable<std::allocator<char>_> *local_380;
  basic_variable<std::allocator<char>_> local_378;
  basic_variable<std::allocator<char>_> local_348;
  undefined1 local_318 [68];
  undefined4 local_2d4;
  size_type local_2d0 [2];
  basic_variable<std::allocator<char>_> *local_2c0;
  basic_variable<std::allocator<char>_> local_2b8;
  basic_variable<std::allocator<char>_> local_288;
  undefined1 local_258 [68];
  undefined4 local_214;
  size_type local_210 [2];
  basic_variable<std::allocator<char>_> *local_200;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  undefined1 local_198 [68];
  undefined4 local_154;
  size_type local_150;
  nullable local_144;
  basic_variable<std::allocator<char>_> *local_140;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  undefined1 local_d8 [76];
  undefined4 local_8c;
  size_type local_88 [3];
  iterator local_70;
  undefined1 local_58 [8];
  insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> inserter;
  variable data;
  
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_70,
             (basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_58,
             (basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,&local_70);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_70);
  local_88[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                          ((basic_variable<std::allocator<char>_> *)
                           &inserter.iter.
                            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                            .current.current);
  local_8c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x42,"void insert_map()",local_88,&local_8c);
  local_140 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_140,"alpha");
  local_140 = &local_108;
  local_144 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_140,&local_144);
  local_d8._0_8_ = &local_138;
  local_d8._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_d8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_d8);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_d8 + 0x10));
  local_cf0 = (basic_variable<std::allocator<char>_> *)local_d8;
  do {
    local_cf0 = local_cf0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cf0);
  } while (local_cf0 != &local_138);
  local_150 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                        ((basic_variable<std::allocator<char>_> *)
                         &inserter.iter.
                          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                          .current.current);
  local_154 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x44,"void insert_map()",&local_150,&local_154);
  local_200 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_200,"bravo");
  local_200 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_200,true);
  local_198._0_8_ = &local_1f8;
  local_198._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_198);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_198 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  local_d18 = (basic_variable<std::allocator<char>_> *)local_198;
  do {
    local_d18 = local_d18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d18);
  } while (local_d18 != &local_1f8);
  local_210[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)
                            &inserter.iter.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  local_214 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x46,"void insert_map()",local_210,&local_214);
  local_2c0 = &local_2b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2c0,"charlie");
  local_2c0 = &local_288;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2c0,2);
  local_258._0_8_ = &local_2b8;
  local_258._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_258 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_258);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_258 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_258 + 0x10));
  local_d40 = (basic_variable<std::allocator<char>_> *)local_258;
  do {
    local_d40 = local_d40 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d40);
  } while (local_d40 != &local_2b8);
  local_2d0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)
                            &inserter.iter.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  local_2d4 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x48,"void insert_map()",local_2d0,&local_2d4);
  local_380 = &local_378;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_380,"delta");
  local_380 = &local_348;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_380,3.0);
  local_318._0_8_ = &local_378;
  local_318._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_318 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_318);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_318 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_318 + 0x10));
  local_d68 = (basic_variable<std::allocator<char>_> *)local_318;
  do {
    local_d68 = local_d68 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d68);
  } while (local_d68 != &local_378);
  local_390[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)
                            &inserter.iter.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  local_394 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x4a,"void insert_map()",local_390,&local_394);
  local_440 = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_440,"echo");
  local_440 = &local_408;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_440,"hydrogen");
  local_3d8._0_8_ = &local_438;
  local_3d8._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_3d8);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_3d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  local_d90 = (basic_variable<std::allocator<char>_> *)local_3d8;
  do {
    local_d90 = local_d90 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d90);
  } while (local_d90 != &local_438);
  local_450[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)
                            &inserter.iter.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  local_454 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x4c,"void insert_map()",local_450,&local_454);
  local_500 = &local_4f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_500,"foxtrot");
  local_500 = &local_4c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_500,L"helium");
  local_498._0_8_ = &local_4f8;
  local_498._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_498 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_498);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_498 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_498 + 0x10));
  local_db8 = (basic_variable<std::allocator<char>_> *)local_498;
  do {
    local_db8 = local_db8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_db8);
  } while (local_db8 != &local_4f8);
  local_510[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)
                            &inserter.iter.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  local_514 = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x4e,"void insert_map()",local_510,&local_514);
  local_5c0 = &local_5b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_5c0,"golf");
  local_5c0 = &local_588;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_5c0,L"lithium");
  local_558._0_8_ = &local_5b8;
  local_558._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_558 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_558);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_558 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_558 + 0x10));
  local_de0 = (basic_variable<std::allocator<char>_> *)local_558;
  do {
    local_de0 = local_de0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_de0);
  } while (local_de0 != &local_5b8);
  local_5d0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)
                            &inserter.iter.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  local_5d4 = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","7",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x50,"void insert_map()",local_5d0,&local_5d4);
  local_680 = &local_678;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_680,"hotel");
  local_680 = &local_648;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_680,L"beryllium");
  local_618._0_8_ = &local_678;
  local_618._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_618 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_618);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator++
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58,0);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     (piVar1);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_618 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  local_e08 = (basic_variable<std::allocator<char>_> *)local_618;
  do {
    local_e08 = local_e08 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e08);
  } while (local_e08 != &local_678);
  local_690[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)
                            &inserter.iter.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  expect.storage._44_4_ = 8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x52,"void insert_map()",local_690,&expect.storage.field_0x2c);
  local_c61 = 1;
  auStack_878._24_8_ = &local_858;
  local_8f8._24_8_ = &local_8d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_8f8._24_8_,"alpha");
  local_8f8._24_8_ = &local_8a8;
  local_8f8._20_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_8f8._24_8_,
             (nullable *)(local_8f8.__data + 0x14));
  auStack_878._8_8_ = &local_8d8;
  auStack_878._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_858,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_878 + 8));
  auStack_978._24_8_ = &local_958;
  auStack_878._24_8_ = &local_828;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_978._24_8_,"bravo");
  auStack_978._24_8_ = &local_928;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_978._24_8_,true);
  local_8f8._0_8_ = &local_958;
  local_8f8._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_828,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &local_8f8.__align);
  auStack_9f8._24_8_ = &local_9d8;
  auStack_878._24_8_ = &local_7f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_9f8._24_8_,"charlie");
  auStack_9f8._24_8_ = &local_9a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_9f8._24_8_,2);
  auStack_978._8_8_ = &local_9d8;
  auStack_978._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_7f8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_978 + 8));
  auStack_a78._24_8_ = &local_a58;
  auStack_878._24_8_ = &local_7c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_a78._24_8_,"delta");
  auStack_a78._24_8_ = &local_a28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)auStack_a78._24_8_,3.0);
  auStack_9f8._8_8_ = &local_a58;
  auStack_9f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_7c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_9f8 + 8));
  auStack_af8._24_8_ = &local_ad8;
  auStack_878._24_8_ = &local_798;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_af8._24_8_,"echo");
  auStack_af8._24_8_ = &local_aa8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_af8._24_8_,"hydrogen");
  auStack_a78._8_8_ = &local_ad8;
  auStack_a78._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_798,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_a78 + 8));
  auStack_b78._24_8_ = &local_b58;
  auStack_878._24_8_ = &local_768;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_b78._24_8_,"foxtrot");
  auStack_b78._24_8_ = &local_b28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_b78._24_8_,L"helium");
  auStack_af8._8_8_ = &local_b58;
  auStack_af8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_768,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_af8 + 8));
  auStack_bf8._24_8_ = &local_bd8;
  auStack_878._24_8_ = &local_738;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_bf8._24_8_,"golf");
  auStack_bf8._24_8_ = &local_ba8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_bf8._24_8_,L"lithium");
  auStack_b78._8_8_ = &local_bd8;
  auStack_b78._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_738,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_b78 + 8));
  local_c60 = &local_c58;
  auStack_878._24_8_ = &local_708;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_c60,"hotel");
  local_c60 = &local_c28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_c60,L"beryllium");
  auStack_bf8._8_8_ = &local_c58;
  auStack_bf8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_708,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_bf8 + 8));
  local_c61 = 0;
  local_6d8._0_8_ = &local_858;
  local_6d8._8_8_ = 8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6d8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_6d8);
  local_e58 = (basic_variable<std::allocator<char>_> *)local_6d8;
  do {
    local_e58 = local_e58 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e58);
  } while (local_e58 != &local_858);
  local_e70 = (basic_variable<std::allocator<char>_> *)auStack_bf8;
  do {
    local_e70 = local_e70 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e70);
  } while (local_e70 != &local_c58);
  local_e88 = (basic_variable<std::allocator<char>_> *)auStack_b78;
  do {
    local_e88 = local_e88 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e88);
  } while (local_e88 != &local_bd8);
  local_ea0 = (basic_variable<std::allocator<char>_> *)auStack_af8;
  do {
    local_ea0 = local_ea0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ea0);
  } while (local_ea0 != &local_b58);
  local_eb8 = (basic_variable<std::allocator<char>_> *)auStack_a78;
  do {
    local_eb8 = local_eb8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_eb8);
  } while (local_eb8 != &local_ad8);
  local_ed0 = (basic_variable<std::allocator<char>_> *)auStack_9f8;
  do {
    local_ed0 = local_ed0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ed0);
  } while (local_ed0 != &local_a58);
  local_ee8 = (basic_variable<std::allocator<char>_> *)auStack_978;
  do {
    local_ee8 = local_ee8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ee8);
  } while (local_ee8 != &local_9d8);
  local_f00 = &local_8f8;
  do {
    local_f00 = (type *)((long)local_f00 + -0x30);
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)&local_f00->__align);
  } while (local_f00 != &local_958);
  local_f18 = (basic_variable<std::allocator<char>_> *)auStack_878;
  do {
    local_f18 = local_f18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_f18);
  } while (local_f18 != &local_8d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c80,
             (basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c98,
             (basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_cb0,(basic_variable<std::allocator<char>_> *)(local_6d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_cc8,(basic_variable<std::allocator<char>_> *)(local_6d8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x61,"void insert_map()",&local_c80,&local_c98,&local_cb0,&local_cc8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cc8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cb0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c98);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c80);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6d8 + 0x10));
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_58);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void insert_map()
{
    variable data = map::make();
    std::insert_iterator<variable> inserter(data, data.begin());

    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 0);
    *inserter++ = {"alpha", null};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
    *inserter++ = {"bravo", true};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 2);
    *inserter++ = {"charlie", 2};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 3);
    *inserter++ = {"delta", 3.0};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 4);
    *inserter++ = {"echo", "hydrogen"};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 5);
    *inserter++ = {"foxtrot", L"helium"};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 6);
    *inserter++ = {"golf", u"lithium"};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 7);
    *inserter++ = {"hotel", U"beryllium"};
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 8);

    variable expect =
        {
            { "alpha", null },
            { "bravo", true },
            { "charlie", 2},
            { "delta", 3.0 },
            { "echo", "hydrogen" },
            { "foxtrot", L"helium" },
            { "golf", u"lithium" },
            { "hotel", U"beryllium" }
        };
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}